

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O0

void RigidBodyDynamics::CalcContactSystemVariables
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  size_t sVar4;
  Scalar *pSVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  long in_R8;
  ReturnType RVar6;
  double dVar7;
  uint i_1;
  Vector3d gamma_i;
  Vector3d prev_body_point;
  uint prev_body_id;
  bool in_stack_000000fb;
  uint in_stack_000000fc;
  VectorNd *in_stack_00000100;
  VectorNd *in_stack_00000108;
  VectorNd *in_stack_00000110;
  Model *in_stack_00000118;
  Vector3d *in_stack_00000130;
  uint i;
  VectorNd *in_stack_00000208;
  VectorNd *in_stack_00000210;
  VectorNd *in_stack_00000218;
  Model *in_stack_00000220;
  VectorNd *in_stack_00000228;
  Model *in_stack_00000230;
  undefined1 in_stack_0000054f;
  MatrixNd *in_stack_00000550;
  VectorNd *in_stack_00000558;
  Model *in_stack_00000560;
  SpatialTransform *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe98;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffea0;
  uint local_ec;
  SpatialTransform *in_stack_ffffffffffffff50;
  SpatialTransform *in_stack_ffffffffffffff58;
  value_type local_94;
  undefined1 in_stack_ffffffffffffff87;
  MatrixNd *in_stack_ffffffffffffff88;
  ConstraintSet *in_stack_ffffffffffffff90;
  VectorNd *in_stack_ffffffffffffff98;
  Model *in_stack_ffffffffffffffa0;
  uint local_2c;
  
  NonlinearEffects(in_stack_00000230,in_stack_00000228,(VectorNd *)in_stack_00000220,
                   in_stack_00000218);
  CompositeRigidBodyAlgorithm
            (in_stack_00000560,in_stack_00000558,in_stack_00000550,(bool)in_stack_0000054f);
  for (local_2c = 1;
      sVar2 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&in_RDI[0x20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish), local_2c < sVar2;
      local_2c = local_2c + 1) {
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(in_RDI + 0x1d),(ulong)local_2c);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)local_2c);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(in_RDI + 0x1e),(ulong)*pvVar3);
    Math::SpatialTransform::operator*(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(in_RDI + 0x1e),(ulong)local_2c);
    Math::SpatialTransform::operator=
              ((SpatialTransform *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
  }
  CalcContactJacobian(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                      in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
  local_94 = 0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffe88);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffe88);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  UpdateKinematicsCustom(in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208);
  local_ec = 0;
  do {
    sVar4 = ConstraintSet::size((ConstraintSet *)0x14df07);
    if (sVar4 <= local_ec) {
      return;
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_R8 + 0x20),
                        (ulong)local_ec);
    if (local_94 == *pvVar3) {
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_R8 + 0x38),(ulong)local_ec);
      bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator!=
                        (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      if (bVar1) goto LAB_0014df7b;
    }
    else {
LAB_0014df7b:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_R8 + 0x20),
                 (ulong)local_ec);
      in_stack_fffffffffffffe88 =
           (SpatialTransform *)
           std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                     ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_R8 + 0x38),
                      (ulong)local_ec);
      in_stack_fffffffffffffe90 = 0;
      CalcPointAcceleration
                (in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000100,
                 in_stack_000000fc,in_stack_00000130,in_stack_000000fb);
      Vector3_t::operator=
                ((Vector3_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (Vector3_t *)in_stack_fffffffffffffe88);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_R8 + 0x20),
                          (ulong)local_ec);
      local_94 = *pvVar3;
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_R8 + 0x38),(ulong)local_ec);
      Vector3_t::operator=
                ((Vector3_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (Vector3_t *)in_stack_fffffffffffffe88);
    }
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        (Index)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffea0 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)*pSVar5;
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_R8 + 0x50),(ulong)local_ec);
    RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       in_stack_fffffffffffffe88);
    dVar7 = (double)in_stack_fffffffffffffea0 - RVar6;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        (Index)in_stack_fffffffffffffe88);
    *pSVar5 = dVar7;
    local_ec = local_ec + 1;
  } while( true );
}

Assistant:

RBDL_DLLAPI
void CalcContactSystemVariables (
		Model &model,
		const Math::VectorNd &Q,
		const Math::VectorNd &QDot,
		const Math::VectorNd &Tau,
		ConstraintSet &CS
		) {
	// Compute C
	NonlinearEffects (model, Q, QDot, CS.C);
	assert (CS.H.cols() == model.dof_count && CS.H.rows() == model.dof_count);

	// Compute H
	CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

	// Compute G
	// We have to update model.X_base as they are not automatically computed
	// by NonlinearEffects()
	for (unsigned int i = 1; i < model.mBodies.size(); i++) {
		model.X_base[i] = model.X_lambda[i] * model.X_base[model.lambda[i]];
	}
	CalcContactJacobian (model, Q, CS, CS.G, false);

	// Compute gamma
	unsigned int prev_body_id = 0;
	Vector3d prev_body_point = Vector3d::Zero();
	Vector3d gamma_i = Vector3d::Zero();

	CS.QDDot_0.setZero();
	UpdateKinematicsCustom (model, NULL, NULL, &CS.QDDot_0);

	for (unsigned int i = 0; i < CS.size(); i++) {
		// only compute point accelerations when necessary
		if (prev_body_id != CS.body[i] || prev_body_point != CS.point[i]) {
			gamma_i = CalcPointAcceleration (model, Q, QDot, CS.QDDot_0, CS.body[i], CS.point[i], false);
			prev_body_id = CS.body[i];
			prev_body_point = CS.point[i];
		}

		// we also substract ContactData[i].acceleration such that the contact
		// point will have the desired acceleration
		CS.gamma[i] = CS.acceleration[i] - CS.normal[i].dot(gamma_i);
	}
}